

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# type_detection.cpp
# Opt level: O1

void __thiscall
duckdb::CSVSniffer::SetUserDefinedDateTimeFormat(CSVSniffer *this,CSVStateMachine *candidate)

{
  mapped_type *pmVar1;
  LogicalTypeId *date_time_format;
  pointer __k;
  initializer_list<duckdb::LogicalTypeId> __l;
  vector<duckdb::LogicalTypeId,_true> data_time_formats;
  allocator_type local_3b;
  LogicalTypeId local_3a [2];
  vector<duckdb::LogicalTypeId,_std::allocator<duckdb::LogicalTypeId>_> local_38;
  
  local_3a[0] = DATE;
  local_3a[1] = TIMESTAMP;
  __l._M_len = 2;
  __l._M_array = local_3a;
  ::std::vector<duckdb::LogicalTypeId,_std::allocator<duckdb::LogicalTypeId>_>::vector
            (&local_38,__l,&local_3b);
  for (__k = local_38.
             super__Vector_base<duckdb::LogicalTypeId,_std::allocator<duckdb::LogicalTypeId>_>.
             _M_impl.super__Vector_impl_data._M_start;
      __k != local_38.
             super__Vector_base<duckdb::LogicalTypeId,_std::allocator<duckdb::LogicalTypeId>_>.
             _M_impl.super__Vector_impl_data._M_finish; __k = __k + 1) {
    pmVar1 = ::std::
             map<duckdb::LogicalTypeId,_duckdb::CSVOption<duckdb::StrpTimeFormat>,_std::less<duckdb::LogicalTypeId>,_std::allocator<std::pair<const_duckdb::LogicalTypeId,_duckdb::CSVOption<duckdb::StrpTimeFormat>_>_>_>
             ::at(&(this->options->dialect_options).date_format,__k);
    if (pmVar1->set_by_user == true) {
      SetDateFormat(candidate,&(pmVar1->value).super_StrTimeFormat.format_specifier,__k);
    }
  }
  if (local_38.super__Vector_base<duckdb::LogicalTypeId,_std::allocator<duckdb::LogicalTypeId>_>.
      _M_impl.super__Vector_impl_data._M_start != (key_type *)0x0) {
    operator_delete(local_38.
                    super__Vector_base<duckdb::LogicalTypeId,_std::allocator<duckdb::LogicalTypeId>_>
                    ._M_impl.super__Vector_impl_data._M_start);
  }
  return;
}

Assistant:

void CSVSniffer::SetUserDefinedDateTimeFormat(CSVStateMachine &candidate) const {
	const vector<LogicalTypeId> data_time_formats {LogicalTypeId::DATE, LogicalTypeId::TIMESTAMP};
	for (auto &date_time_format : data_time_formats) {
		auto &user_option = options.dialect_options.date_format.at(date_time_format);
		if (user_option.IsSetByUser()) {
			SetDateFormat(candidate, user_option.GetValue().format_specifier, date_time_format);
		}
	}
}